

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

DWORD __thiscall TBitEntryArray::GetItem(TBitEntryArray *this,DWORD EntryIndex)

{
  int iVar1;
  uint *puVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  iVar1 = *(int *)&(this->super_TGenericArray<unsigned_int>).field_0x14;
  uVar5 = EntryIndex * iVar1;
  uVar4 = (ulong)(uVar5 >> 5);
  puVar2 = (this->super_TGenericArray<unsigned_int>).ItemArray;
  if (iVar1 + (uVar5 & 0x1f) < 0x21) {
    uVar5 = puVar2[uVar4] >> (sbyte)(uVar5 & 0x1f);
  }
  else {
    bVar3 = (byte)uVar5 & 0x1f;
    uVar5 = puVar2[uVar4] >> bVar3 | puVar2[uVar4 + 1] << 0x20 - bVar3;
  }
  return uVar5 & this->EntryBitMask;
}

Assistant:

DWORD GetItem(DWORD EntryIndex)
    {
        DWORD dwItemIndex = (EntryIndex * BitsPerEntry) >> 0x05;
        DWORD dwStartBit = (EntryIndex * BitsPerEntry) & 0x1F;
        DWORD dwEndBit = dwStartBit + BitsPerEntry;
        DWORD dwResult;

        // If the end bit index is greater than 32,
        // we also need to load from the next 32-bit item
        if(dwEndBit > 0x20)
        {
            dwResult = (ItemArray[dwItemIndex + 1] << (0x20 - dwStartBit)) | (ItemArray[dwItemIndex] >> dwStartBit);
        }
        else
        {
            dwResult = ItemArray[dwItemIndex] >> dwStartBit;
        }

        // Now we also need to mask the result by the bit mask
        return dwResult & EntryBitMask;
    }